

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  cmCTestTestProperties *testProperties;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  Value *pVVar6;
  string *value;
  _Base_ptr p_Var7;
  StreamWriter *pSVar8;
  _Rb_tree_color _Var9;
  ArrayIndex backtrace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  Value testInfo;
  Value result;
  Value tests;
  BacktraceData backtraceGraph;
  cmWorkingDirectory workdir;
  StreamWriterBuilder builder;
  UInt local_4d4;
  cmCTestMultiProcessHandler *local_4d0;
  ValueHolder local_4c8;
  undefined8 uStack_4c0;
  long local_4b8 [3];
  _Rb_tree_node_base *local_4a0;
  Value local_498;
  Value local_470;
  Value local_448;
  Value local_420;
  BacktraceData local_3f8;
  cmWorkingDirectory local_2d8;
  cmCTestRunTest local_2b0;
  
  pcVar1 = this->TestHandler;
  _Var9 = _S_red;
  local_4d0 = this;
  for (p_Var5 = (this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->PendingTests).
       super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((int)_Var9 < (int)p_Var5[1]._M_color) {
      _Var9 = p_Var5[1]._M_color;
    }
  }
  pcVar1->MaxIndex = _Var9;
  Json::Value::Value(&local_448,objectValue);
  Json::Value::Value((Value *)&local_2b0,"ctestInfo");
  pVVar6 = Json::Value::operator[](&local_448,"kind");
  Json::Value::operator=(pVVar6,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_3f8,objectValue);
  Json::Value::Value((Value *)&local_2b0,1);
  pVVar6 = Json::Value::operator[]((Value *)&local_3f8,"major");
  Json::Value::operator=(pVVar6,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  Json::Value::Value((Value *)&local_2b0,0);
  pVVar6 = Json::Value::operator[]((Value *)&local_3f8,"minor");
  Json::Value::operator=(pVVar6,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  pVVar6 = Json::Value::operator[](&local_448,"version");
  Json::Value::operator=(pVVar6,(Value *)&local_3f8);
  Json::Value::~Value((Value *)&local_3f8);
  BacktraceData::BacktraceData(&local_3f8);
  Json::Value::Value(&local_420,arrayValue);
  p_Var7 = (local_4d0->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4a0 = &(local_4d0->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_4a0) {
    do {
      testProperties = (cmCTestTestProperties *)p_Var7[1]._M_parent;
      cmWorkingDirectory::cmWorkingDirectory(&local_2d8,&testProperties->Directory);
      cmCTestRunTest::cmCTestRunTest(&local_2b0,local_4d0,testProperties->Index);
      cmCTestRunTest::ComputeArguments(&local_2b0);
      pbVar2 = (testProperties->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(testProperties->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
LAB_002985bc:
        Json::Value::Value(&local_498,objectValue);
        Json::Value::Value(&local_470,&testProperties->Name);
        pVVar6 = Json::Value::operator[](&local_498,"name");
        Json::Value::operator=(pVVar6,&local_470);
        Json::Value::~Value(&local_470);
        value = cmCTest::GetConfigType_abi_cxx11_(local_2b0.CTest);
        if (value->_M_string_length != 0) {
          Json::Value::Value(&local_470,value);
          pVVar6 = Json::Value::operator[](&local_498,"config");
          Json::Value::operator=(pVVar6,&local_470);
          Json::Value::~Value(&local_470);
        }
        if (local_2b0.ActualCommand._M_string_length != 0) {
          local_4c8.int_ = 0;
          uStack_4c0 = 0;
          local_4b8[0] = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4c8,&local_2b0.ActualCommand);
          if (local_2b0.Arguments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_2b0.Arguments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4c8,
                      ((long)local_2b0.Arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2b0.Arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4c8,uStack_4c0,
                       local_2b0.Arguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_2b0.Arguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          DumpToJsonArray(&local_470,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_4c8);
          pVVar6 = Json::Value::operator[](&local_498,"command");
          Json::Value::operator=(pVVar6,&local_470);
          Json::Value::~Value(&local_470);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4c8);
        }
        DumpCTestProperties((Value *)&local_4c8,testProperties);
        bVar3 = Json::Value::empty((Value *)&local_4c8);
        if (!bVar3) {
          pVVar6 = Json::Value::operator[](&local_498,"properties");
          Json::Value::operator=(pVVar6,(Value *)&local_4c8);
        }
        bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                          (&(testProperties->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
        if (!bVar3) {
          bVar3 = BacktraceData::Add(&local_3f8,&testProperties->Backtrace,&local_4d4);
          if (bVar3) {
            Json::Value::Value(&local_470,local_4d4);
            pVVar6 = Json::Value::operator[](&local_498,"backtrace");
            Json::Value::operator=(pVVar6,&local_470);
            Json::Value::~Value(&local_470);
          }
        }
        Json::Value::~Value((Value *)&local_4c8);
        Json::Value::append(&local_420,&local_498);
        Json::Value::~Value(&local_498);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
        if (iVar4 != 0) goto LAB_002985bc;
      }
      cmCTestRunTest::~cmCTestRunTest(&local_2b0);
      cmWorkingDirectory::~cmWorkingDirectory(&local_2d8);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_4a0);
  }
  BacktraceData::Dump((Value *)&local_2b0,&local_3f8);
  pVVar6 = Json::Value::operator[](&local_448,"backtraceGraph");
  Json::Value::operator=(pVVar6,(Value *)&local_2b0);
  Json::Value::~Value((Value *)&local_2b0);
  pVVar6 = Json::Value::operator[](&local_448,"tests");
  Json::Value::operator=(pVVar6,&local_420);
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)&local_2b0);
  Json::Value::Value(&local_470,"  ");
  local_4c8.string_ = (char *)local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"indentation","");
  pVVar6 = Json::StreamWriterBuilder::operator[]
                     ((StreamWriterBuilder *)&local_2b0,(String *)&local_4c8);
  Json::Value::operator=(pVVar6,&local_470);
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8.string_,local_4b8[0] + 1);
  }
  Json::Value::~Value(&local_470);
  pSVar8 = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)&local_2b0);
  (*pSVar8->_vptr_StreamWriter[2])(pSVar8,&local_448,&std::cout);
  (*pSVar8->_vptr_StreamWriter[1])(pSVar8);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)&local_2b0);
  Json::Value::~Value(&local_420);
  Json::Value::~Value(&local_3f8.Nodes);
  Json::Value::~Value(&local_3f8.Files);
  Json::Value::~Value(&local_3f8.Commands);
  std::
  _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_3f8.NodeMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_3f8.FileMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3f8);
  Json::Value::~Value(&local_448);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this, p.Index);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}